

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O0

uint32_t ivk::cmd_add64(void *el)

{
  iterator iVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  pointer ppVar5;
  long lVar6;
  _Self local_108;
  allocator local_f9;
  string local_f8 [32];
  _Base_ptr local_d8;
  long local_d0;
  int64_t b;
  allocator local_b9;
  string local_b8 [32];
  _Base_ptr local_98;
  long local_90;
  int64_t a;
  allocator local_69;
  string local_68 [32];
  _Self local_48;
  iterator it;
  char *vo;
  char *vb;
  char *va;
  XMLElement *pEl;
  XMLElement **ppEl;
  void *el_local;
  
  if (el == (void *)0x0) {
    el_local._4_4_ = 2;
  }
  else {
    pcVar3 = get_attr_val((XMLElement **)el,"va");
    pcVar4 = get_attr_val((XMLElement **)el,"vb");
    it._M_node = (_Base_ptr)get_attr_val((XMLElement **)el,"vo");
    if (((pcVar3 == (char *)0x0) || (pcVar4 == (char *)0x0)) || (it._M_node == (_Base_ptr)0x0)) {
      el_local._4_4_ = 5;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_68,pcVar3,&local_69);
      local_48._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                   *)gCmdMemMap_abi_cxx11_,(key_type *)local_68);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
      a = (int64_t)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                   ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                          *)gCmdMemMap_abi_cxx11_);
      bVar2 = std::operator==(&local_48,(_Self *)&a);
      if (bVar2) {
        el_local._4_4_ = 7;
      }
      else {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>
                 ::operator->(&local_48);
        local_90 = *(long *)(ppVar5->second).data;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b8,pcVar4,&local_b9);
        local_98 = (_Base_ptr)
                   std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                           *)gCmdMemMap_abi_cxx11_,(key_type *)local_b8);
        local_48._M_node = local_98;
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        b = (int64_t)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                     ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                            *)gCmdMemMap_abi_cxx11_);
        bVar2 = std::operator==(&local_48,(_Self *)&b);
        if (bVar2) {
          el_local._4_4_ = 7;
        }
        else {
          ppVar5 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>
                   ::operator->(&local_48);
          iVar1 = it;
          local_d0 = *(long *)(ppVar5->second).data;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_f8,(char *)iVar1._M_node,&local_f9);
          local_d8 = (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                     ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                             *)gCmdMemMap_abi_cxx11_,(key_type *)local_f8);
          local_48._M_node = local_d8;
          std::__cxx11::string::~string(local_f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_f9);
          local_108._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
               ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                      *)gCmdMemMap_abi_cxx11_);
          bVar2 = std::operator==(&local_48,&local_108);
          if (bVar2) {
            el_local._4_4_ = 7;
          }
          else {
            lVar6 = local_90 + local_d0;
            ppVar5 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>
                     ::operator->(&local_48);
            *(long *)(ppVar5->second).data = lVar6;
            el_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return el_local._4_4_;
}

Assistant:

uint32_t ivk::cmd_add64(void *el) {
    if(!el){
        return proc_param_err;
    }
    XMLElement** ppEl = (XMLElement**)el;
    XMLElement* pEl = *ppEl;

    const char* va = get_attr_val(ppEl,"va");
    const char* vb = get_attr_val(ppEl,"vb");
    const char* vo = get_attr_val(ppEl,"vo");
    if(!va || !vb || !vo){
        return proc_xml_err;
    }
    // get mem
    map<string,proc_data>::iterator it = gCmdMemMap.find(va);
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }
    int64_t a = *(int64_t*)it->second.data;

    it = gCmdMemMap.find(vb);
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }
    int64_t b = *(int64_t*)it->second.data;

    it = gCmdMemMap.find(vo);
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }
    *(int64_t*)it->second.data = a+b;

    return proc_success;
}